

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,void **key,
          MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
          **value)

{
  BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  uint uVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  hash_t hashCode;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  int iVar9;
  undefined8 in_RCX;
  ulong uVar10;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined8 extraout_RDX_00;
  long lVar12;
  DefaultHashedEntry<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>>,JsUtil::(anonymous_namespace)::KeyValueEntry>
  *pDVar13;
  long lVar14;
  uint uVar15;
  WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
  local_58;
  WriteBarrierPtr<void> local_50;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  **local_48;
  ulong local_40;
  uint local_34;
  
  lVar12 = *(long *)this;
  local_48 = value;
  if (lVar12 == 0) {
    BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar12 = *(long *)this;
  }
  hashCode = GetHashCodeWithKey<void*>(key);
  local_40 = CONCAT44(local_40._4_4_,hashCode);
  local_34 = BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket((BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          *)this,hashCode);
  lVar3 = *(long *)(this + 8);
  pDVar13 = (DefaultHashedEntry<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>>,JsUtil::(anonymous_namespace)::KeyValueEntry>
             *)(lVar12 + (ulong)local_34 * 4);
  uVar15 = 0;
  uVar11 = extraout_RDX;
  while( true ) {
    iVar9 = (int)in_RCX;
    if ((long)*(int *)pDVar13 < 0) break;
    pDVar13 = (DefaultHashedEntry<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>>,JsUtil::(anonymous_namespace)::KeyValueEntry>
               *)((long)*(int *)pDVar13 * 0x18 + lVar3);
    bVar5 = DefaultHashedEntry<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>>,JsUtil::(anonymous_namespace)::KeyValueEntry>
            ::KeyEquals<Js::SameValueComparerCommon<void*,true>,void*>(pDVar13,key,(hash_t)uVar11);
    if (bVar5) {
      if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar15);
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
      if (bVar5) {
        *puVar8 = 0;
        return -1;
      }
      goto LAB_00b88d2b;
    }
    uVar15 = uVar15 + 1;
    pDVar13 = pDVar13 + 8;
    uVar11 = extraout_RDX_00;
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar15);
  }
  if (*(int *)(this + 0x28) == 0) {
    uVar7 = *(uint *)(this + 0x18);
    uVar2 = *(uint *)(this + 0x20);
    if (uVar2 == uVar7) {
      BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      local_34 = BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket((BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                              *)this,(hash_t)local_40);
      uVar7 = *(uint *)(this + 0x18);
      uVar2 = *(uint *)(this + 0x20);
    }
    uVar10 = (ulong)uVar2;
    iVar9 = uVar2 + 1;
    *(int *)(this + 0x20) = iVar9;
    if ((int)uVar7 < iVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      iVar9 = 0xdf6ecb;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar5) goto LAB_00b88d2b;
      *puVar8 = 0;
      uVar7 = *(uint *)(this + 0x18);
    }
    if ((int)uVar7 <= (int)uVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      iVar9 = 0xdf6ee8;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar5) goto LAB_00b88d2b;
      *puVar8 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      iVar9 = 0xdf6e6b;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar5) goto LAB_00b88d2b;
      *puVar8 = 0;
    }
    uVar7 = *(uint *)(this + 0x24);
    if ((int)uVar7 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      iVar9 = 0xdf6e89;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar5) goto LAB_00b88d2b;
      *puVar8 = 0;
      uVar7 = *(uint *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= (int)uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      iVar9 = 0xdf6eaa;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar5) {
LAB_00b88d2b:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
      uVar7 = *(uint *)(this + 0x24);
    }
    uVar10 = (ulong)uVar7;
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar6 = BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)(int)uVar7 * 0x18 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar6;
    }
  }
  lVar14 = (long)(int)uVar10 * 0x18;
  lVar12 = *(long *)(this + 8);
  local_40 = uVar10;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&local_50,*key);
  Memory::
  WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
  ::WriteBarrierSet(&local_58,*local_48);
  DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ::Set((DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         *)(lVar12 + lVar14),&local_50,&local_58,iVar9);
  lVar12 = *(long *)this;
  lVar3 = *(long *)(this + 8);
  *(undefined4 *)(lVar3 + 8 + lVar14) = *(undefined4 *)(lVar12 + (ulong)local_34 * 4);
  iVar9 = (int)local_40;
  *(int *)(lVar12 + (ulong)local_34 * 4) = (int)uVar10;
  uVar15 = 0;
  uVar10 = local_40 & 0xffffffff;
  do {
    uVar7 = *(uint *)(lVar3 + 8 + (long)(int)uVar10 * 0x18);
    uVar10 = (ulong)uVar7;
    uVar15 = uVar15 + 1;
  } while (uVar7 != 0xffffffff);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar15);
  }
  return iVar9;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }